

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

QColor QColorDialog::getColor
                 (QColor *initial,QWidget *parent,QString *title,ColorDialogOptions options)

{
  undefined8 uVar1;
  QWidget *this;
  Data *pDVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QColor QVar4;
  QAutoPointer<QColorDialog> local_50;
  undefined4 local_40;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  undefined4 local_38;
  undefined2 uStack_34;
  undefined2 uStack_32;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QWidget *)operator_new(0x28);
  QColorDialog((QColorDialog *)this,parent);
  pDVar2 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
  local_50.o.wp.d = pDVar2;
  local_50.o.wp.value = (QObject *)this;
  if ((title->d).size != 0) {
    QWidget::setWindowTitle(this,title);
  }
  setOptions((QColorDialog *)this,options);
  QColorDialogPrivate::setCurrentColor
            (*(QColorDialogPrivate **)&this->field_0x8,initial,SetColorAll);
  (**(code **)(*(long *)this + 0x1a8))(this);
  if (*(int *)(pDVar2 + 4) == 0) {
    local_40 = 0;
    uStack_3c = 0xffff;
    uStack_3a = 0;
    local_38 = 0;
    uStack_34 = 0;
    uVar3 = 0xffff00000000;
  }
  else {
    uVar3 = *(undefined8 *)(*(long *)&this->field_0x8 + 0x350);
    uVar1 = *(undefined8 *)(*(long *)&this->field_0x8 + 0x358);
    local_38 = (undefined4)uVar1;
    uStack_34 = (undefined2)((ulong)uVar1 >> 0x20);
  }
  QAutoPointer<QColorDialog>::~QAutoPointer(&local_50);
  QVar4.ct.argb.pad = uStack_34;
  QVar4.ct._4_4_ = local_38;
  QVar4._14_2_ = uStack_32;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar4._0_8_ = uVar3;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QColor QColorDialog::getColor(const QColor &initial, QWidget *parent, const QString &title,
                              ColorDialogOptions options)
{
    QAutoPointer<QColorDialog> dlg(new QColorDialog(parent));
    if (!title.isEmpty())
        dlg->setWindowTitle(title);
    dlg->setOptions(options);
    dlg->setCurrentColor(initial);

    // If the dlg was deleted with a parent window,
    // dlg == nullptr after leaving the exec().
    dlg->exec();
    if (bool(dlg))
        return dlg->selectedColor();
    else
        return QColor();
}